

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[19],kj::String&,char_const(&)[14],kj::String&,char_const(&)[23],kj::String&,char_const(&)[15],kj::String&,char_const(&)[6]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [19],
          String *params_2,char (*params_3) [14],String *params_4,char (*params_5) [23],
          String *params_6,char (*params_7) [15],String *params_8,char (*params_9) [6])

{
  StringTree *pSVar1;
  char (*value) [19];
  String *pSVar2;
  char (*value_00) [14];
  char (*value_01) [23];
  char (*value_02) [15];
  char (*value_03) [6];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  String *local_48;
  String *params_local_4;
  char (*params_local_3) [14];
  String *params_local_2;
  char (*params_local_1) [19];
  StringTree *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_48 = (String *)params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [14])params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [19])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = ::const((char (*) [19])params_local_2);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[19]>(value);
  pSVar2 = fwd<kj::String&>((String *)params_local_3);
  local_68 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_00 = ::const((char (*) [14])params_local_4);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[14]>(value_00);
  pSVar2 = fwd<kj::String&>(local_48);
  local_88 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_01 = ::const((char (*) [23])params_4);
  local_98 = _::toStringTreeOrCharSequence<char_const(&)[23]>(value_01);
  pSVar2 = fwd<kj::String&>((String *)params_5);
  local_a8 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_02 = ::const((char (*) [15])params_6);
  local_b8 = _::toStringTreeOrCharSequence<char_const(&)[15]>(value_02);
  pSVar2 = fwd<kj::String&>((String *)params_7);
  local_c8 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_03 = ::const((char (*) [6])params_8);
  local_d8 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_03);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,pSVar1,(StringTree *)&local_58,&local_68,&local_78,&local_88,
             &local_98,&local_a8,&local_b8,&local_c8,&local_d8,
             (ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}